

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

size_t Map_EnumObjects(PCASC_MAP pMap,void **ppvArray)

{
  ulong local_30;
  size_t i;
  size_t nIndex;
  void **ppvArray_local;
  PCASC_MAP pMap_local;
  
  i = 0;
  if ((pMap == (PCASC_MAP)0x0) || (ppvArray == (void **)0x0)) {
    pMap_local = (PCASC_MAP)0x0;
  }
  else {
    for (local_30 = 0; local_30 < pMap->TableSize; local_30 = local_30 + 1) {
      if (pMap->HashTable[local_30] != (void *)0x0) {
        ppvArray[i] = pMap->HashTable[local_30];
        i = i + 1;
      }
    }
    pMap_local = (PCASC_MAP)pMap->ItemCount;
  }
  return (size_t)pMap_local;
}

Assistant:

size_t Map_EnumObjects(PCASC_MAP pMap, void **ppvArray)
{
    size_t nIndex = 0;

    // Verify pointer to the map
    if(pMap != NULL && ppvArray != NULL)
    {
        // Enumerate all items in main table
        for(size_t i = 0; i < pMap->TableSize; i++)
        {
            // Is that cell valid?
            if(pMap->HashTable[i] != NULL)
            {
                ppvArray[nIndex++] = pMap->HashTable[i];
            }
        }

        return pMap->ItemCount;
    }

    return 0;
}